

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Registry.cpp
# Opt level: O2

void __thiscall SoapySDR::Registry::~Registry(Registry *this)

{
  if ((this->_name)._M_string_length != 0) {
    getFunctionTable_abi_cxx11_();
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>_>_>
    ::erase(&getFunctionTable[abi:cxx11]()::table_abi_cxx11_._M_t,&this->_name);
  }
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

SoapySDR::Registry::~Registry(void)
{
    //erase entry
    if (_name.empty()) return;
    getFunctionTable().erase(_name);
}